

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

cpputest_longlong __thiscall MockNamedValue::getLongLongIntValue(MockNamedValue *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  MockNamedValue *local_18;
  MockNamedValue *this_local;
  
  local_18 = this;
  SimpleString::SimpleString(&local_28,"int");
  bVar1 = operator==(&this->type_,&local_28);
  SimpleString::~SimpleString(&local_28);
  if (bVar1) {
    this_local = (MockNamedValue *)(long)(this->value_).intValue_;
  }
  else {
    SimpleString::SimpleString(local_48,"unsigned int");
    bVar1 = operator==(&this->type_,local_48);
    SimpleString::~SimpleString(local_48);
    if (bVar1) {
      this_local = (MockNamedValue *)(ulong)(this->value_).unsignedIntValue_;
    }
    else {
      SimpleString::SimpleString(&local_58,"long int");
      bVar1 = operator==(&this->type_,&local_58);
      SimpleString::~SimpleString(&local_58);
      if (bVar1) {
        this_local = (MockNamedValue *)(this->value_).stringValue_;
      }
      else {
        SimpleString::SimpleString(&local_68,"unsigned long int");
        bVar1 = operator==(&this->type_,&local_68);
        SimpleString::~SimpleString(&local_68);
        if (bVar1) {
          this_local = (MockNamedValue *)(this->value_).stringValue_;
        }
        else {
          pUVar2 = UtestShell::getCurrent();
          pcVar3 = SimpleString::asCharString(&this->type_);
          pTVar4 = UtestShell::getCurrentTestTerminator();
          (*pUVar2->_vptr_UtestShell[9])
                    (pUVar2,"long long int",pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                     ,0x107,pTVar4);
          this_local = (MockNamedValue *)(this->value_).stringValue_;
        }
      }
    }
  }
  return (cpputest_longlong)this_local;
}

Assistant:

cpputest_longlong MockNamedValue::getLongLongIntValue() const
{
    if(type_ == "int")
        return value_.intValue_;
    else if(type_ == "unsigned int")
        return (long long int)value_.unsignedIntValue_;
    else if(type_ == "long int")
        return value_.longIntValue_;
    else if(type_ == "unsigned long int")
        return (long long int)value_.unsignedLongIntValue_;
    else
    {
        STRCMP_EQUAL("long long int", type_.asCharString());
        return value_.longLongIntValue_;
    }
}